

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

void cs_impl::list_cs_ext::push_front(list *lst,var *val)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  any local_28;
  any local_20;
  
  local_28.mDat = val->mDat;
  if (local_28.mDat != (proxy *)0x0) {
    (local_28.mDat)->refcount = (local_28.mDat)->refcount + 1;
  }
  cs::copy((EVP_PKEY_CTX *)&local_20,(EVP_PKEY_CTX *)&local_28);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)local_20.mDat;
  local_20.mDat = (proxy *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  any::recycle(&local_20);
  any::recycle(&local_28);
  return;
}

Assistant:

void push_front(list &lst, const var &val)
		{
			lst.push_front(copy(val));
		}